

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  lua_State *L_00;
  StkId key;
  TValue *slot;
  TString *x_;
  TValue *io;
  TValue *stv;
  TValue *o;
  TString *ts;
  lua_State *L;
  size_t l_local;
  char *str_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  o = (TValue *)luaS_newlstr(L_00,str,l);
  slot = luaH_getstr(ls->h,(TString *)o);
  if ((slot->tt_ & 0xf) == 0) {
    key = (L_00->top).p;
    (L_00->top).p = key + 1;
    *(TValue **)key = o;
    (key->val).tt_ = ((TString *)o)->tt | 0x40;
    luaH_finishset(L_00,ls->h,&key->val,slot,(TValue *)key);
    if (0 < L_00->l_G->GCdebt) {
      luaC_step(L_00);
    }
    (L_00->top).p = (StkId)((L_00->top).offset + -0x10);
  }
  else {
    o = (TValue *)slot[1].value_.gc;
  }
  return (TString *)o;
}

Assistant:

TString *luaX_newstring (LexState *ls, const char *str, size_t l) {
  lua_State *L = ls->L;
  TString *ts = luaS_newlstr(L, str, l);  /* create new string */
  const TValue *o = luaH_getstr(ls->h, ts);
  if (!ttisnil(o))  /* string already present? */
    ts = keystrval(nodefromval(o));  /* get saved copy */
  else {  /* not in use yet */
    TValue *stv = s2v(L->top.p++);  /* reserve stack space for string */
    setsvalue(L, stv, ts);  /* temporarily anchor the string */
    luaH_finishset(L, ls->h, stv, o, stv);  /* t[string] = string */
    /* table is not a metatable, so it does not need to invalidate cache */
    luaC_checkGC(L);
    L->top.p--;  /* remove string from stack */
  }
  return ts;
}